

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

ndicapi * ndiOpenNetwork(char *hostname,int port)

{
  undefined8 in_RAX;
  ndicapi *pnVar1;
  size_t __n;
  char *pcVar2;
  NDISocketHandle socket;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  ndiSocketOpen(hostname,port,&local_34);
  if (local_34 != -1) {
    pnVar1 = (ndicapi *)calloc(1,0x4588);
    if (pnVar1 != (ndicapi *)0x0) {
      __n = strlen(hostname);
      pcVar2 = (char *)operator_new__(__n + 1);
      strncpy(pcVar2,hostname,__n);
      pnVar1->Hostname = pcVar2;
      pnVar1->Port = port;
      pnVar1->Socket = local_34;
      pnVar1->SerialDevice = -1;
      pcVar2 = (char *)calloc(1,0x800);
      pnVar1->Command = pcVar2;
      pcVar2 = (char *)calloc(1,0x800);
      pnVar1->Reply = pcVar2;
      pcVar2 = (char *)calloc(1,0x800);
      pnVar1->ReplyNoCRC = pcVar2;
      return pnVar1;
    }
    ndiSocketClose(local_34);
  }
  return (ndicapi *)0x0;
}

Assistant:

ndicapiExport ndicapi* ndiOpenNetwork(const char* hostname, int port)
{
  NDISocketHandle socket;
  ndicapi* device;

  int connected = ndiSocketOpen(hostname, port, socket);

  if (socket == -1 || connected == -1)
  {
    return NULL;
  }

  device = (ndicapi*)malloc(sizeof(ndicapi));

  if (device == 0)
  {
    ndiSocketClose(socket);
    return NULL;
  }

  memset(device, 0, sizeof(ndicapi));
  device->Hostname = new char[strlen(hostname) + 1];
  device->Hostname = strncpy(device->Hostname, hostname, strlen(hostname));
  device->Port = port;
  device->Socket = socket;
  device->SerialDevice = NDI_INVALID_HANDLE;
  device->SerialDeviceName = NULL;

  // allocate the buffers
  device->Command = (char*)malloc(2048);
  device->Reply = (char*)malloc(2048);
  device->ReplyNoCRC = (char*)malloc(2048);

  // initialize the allocated memory
  memset(device->Command, 0, 2048);
  memset(device->Reply, 0, 2048);
  memset(device->ReplyNoCRC, 0, 2048);

  return device;
}